

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cc
# Opt level: O2

int __thiscall sptk::swipe::minv(swipe *this,vector yr_vector)

{
  double dVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  double dVar5;
  
  uVar3 = 0;
  uVar4 = (ulong)this & 0xffffffff;
  if ((int)this < 1) {
    uVar4 = uVar3;
  }
  dVar5 = 32767.0;
  uVar2 = 0xffffffffffffffff;
  for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
    dVar1 = *(double *)(yr_vector._0_8_ + uVar3 * 8);
    if (dVar1 < dVar5) {
      uVar2 = uVar3;
    }
    uVar2 = uVar2 & 0xffffffff;
    if (dVar5 <= dVar1) {
      dVar1 = dVar5;
    }
    dVar5 = dVar1;
  }
  return (int)uVar2;
}

Assistant:

int minv(vector yr_vector) {
    int index = -1;
    double val = SHRT_MAX;
    int i;
    for (i = 0; i < yr_vector.x; i++) {
        if (yr_vector.v[i] < val) {
            val = yr_vector.v[i];
            index = i;
        }
    }
    return(index);
}